

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser::addIncludesRecursive(Parser *this,QString *filename,QList<QString> *includes)

{
  Data *pDVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  qsizetype qVar4;
  bool bVar5;
  int iVar6;
  int __oflag;
  undefined8 uVar7;
  long in_FS_OFFSET;
  QStringView str;
  QFileInfo info2;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression includeMacro;
  QTextStream stream;
  QFileInfo info;
  QString local_148;
  QString local_128;
  QFileInfo local_110;
  QString local_108;
  QRegularExpressionMatch local_e8;
  QRegularExpression local_e0;
  undefined1 local_d8 [24];
  undefined8 uStack_c0;
  undefined8 local_b8;
  QIODevice local_a8;
  QFileInfo local_90;
  QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> local_88;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&local_90,filename);
  local_a8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_a8,filename);
  iVar6 = QFile::open((QFile *)&local_a8,(char *)0x11,__oflag);
  if ((char)iVar6 != '\0') {
    local_d8._16_8_ = (QArrayData *)0x0;
    uStack_c0 = 0;
    local_b8 = 0;
    local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)(local_d8 + 8),&local_a8);
    bVar5 = QTextStream::atEnd((QTextStream *)(local_d8 + 8));
    if (!bVar5) {
      do {
        local_88.a.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.a.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.a.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QTextStream::readLine(&local_58,(QTextStream *)(local_d8 + 8),0);
        QString::trimmed_helper((QString *)&local_88,&local_58);
        pDVar1 = local_58.d.d;
        if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_58.d.d !=
            (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_58.d.d)->super_QArrayData)->a).
                   d.d = *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                                   &(local_58.d.d)->super_QArrayData)->a).d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&pDVar1->super_QArrayData)->a).d.d
              == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_58.d.ptr = (char16_t *)CONCAT71(local_58.d.ptr._1_7_,10);
        local_58.d.d = (Data *)&local_88;
        operator+=((QString *)(local_d8 + 0x10),(QStringBuilder<QString_&,_QLatin1Char> *)&local_58)
        ;
        if (&(local_88.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_88.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_88.a.a.d.d)->super_QArrayData,2,0x10);
          }
        }
        bVar5 = QTextStream::atEnd((QTextStream *)(local_d8 + 8));
      } while (!bVar5);
    }
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88.a.a.d.d = (Data *)0x0;
    local_88.a.a.d.ptr = L"#include [\"<]([A-Za-z0-9_./-]*.h)[\">]";
    local_88.a.a.d.size = 0x25;
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)local_d8,(QString *)&local_88,(PatternOptions)0x0);
    if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_88.a.a.d.d !=
        (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_88.a.a.d.d)->super_QArrayData)->a).
               d.d = *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                               &(local_88.a.a.d.d)->super_QArrayData)->a).d.d + -1;
      UNLOCK();
      if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_88.a.a.d.d)->super_QArrayData)
                   ->a).d.d == 0) {
        QArrayData::deallocate(&(local_88.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_e0.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    uVar7 = 0;
    QRegularExpression::globalMatch
              (&local_e0,(QString *)local_d8,(qsizetype)(local_d8 + 0x10),NormalMatch,
               (MatchOptions)0x0);
    bVar5 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_e0);
    if (bVar5) {
      do {
        local_e8.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_e8);
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QRegularExpressionMatch::captured(&local_58,&local_e8,1);
        local_108.d.d = local_58.d.d;
        local_108.d.ptr = local_58.d.ptr;
        local_108.d.size = local_58.d.size;
        if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_58.d.d !=
            (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_58.d.d)->super_QArrayData)->a).
                   d.d = *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                                   &(local_58.d.d)->super_QArrayData)->a).d.d + 1;
          UNLOCK();
        }
        local_88.a.a.d.d = (Data *)0x0;
        local_88.a.a.d.ptr = L"../";
        local_88.a.a.d.size = 3;
        bVar5 = QString::startsWith(&local_58,(QString *)&local_88,CaseSensitive);
        if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_88.a.a.d.d !=
            (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_88.a.a.d.d)->super_QArrayData)
                   ->a).d.d =
               *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                         &(local_88.a.a.d.d)->super_QArrayData)->a).d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                        &(local_88.a.a.d.d)->super_QArrayData)->a).d.d == 0) {
            QArrayData::deallocate(&(local_88.a.a.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar5) {
          local_110.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::absolutePath(&local_148,&local_90);
          local_88.a.a.d.size = local_148.d.size;
          local_88.a.a.d.ptr = local_148.d.ptr;
          local_88.a.a.d.d = local_148.d.d;
          local_148.d.size = 0;
          local_148.d.d = (Data *)0x0;
          local_148.d.ptr = (char16_t *)0x0;
          local_88.a.b.ch = '/';
          local_88.b = &local_58;
          QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&>::convertTo<QString>
                    (&local_128,&local_88);
          QFileInfo::QFileInfo(&local_110,&local_128);
          if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_88.a.a.d.d !=
              (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_88.a.a.d.d)->super_QArrayData
                      )->a).d.d =
                 *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                           &(local_88.a.a.d.d)->super_QArrayData)->a).d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                          &(local_88.a.a.d.d)->super_QArrayData)->a).d.d == 0) {
              QArrayData::deallocate(&(local_88.a.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_148.d.d !=
              (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_148.d.d)->super_QArrayData)->
                     a).d.d =
                 *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                           &(local_148.d.d)->super_QArrayData)->a).d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                          &(local_148.d.d)->super_QArrayData)->a).d.d == 0) {
              QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
            }
          }
          bVar5 = QFileInfo::exists(&local_110);
          if (bVar5) {
            QFileInfo::absoluteFilePath((QString *)&local_88,&local_110);
            qVar4 = local_88.a.a.d.size;
            pDVar3 = local_88.a.a.d.d;
            pcVar2 = local_108.d.ptr;
            pDVar1 = local_108.d.d;
            local_88.a.a.d.d = local_108.d.d;
            local_108.d.d = pDVar3;
            local_108.d.ptr = local_88.a.a.d.ptr;
            local_88.a.a.d.ptr = pcVar2;
            local_88.a.a.d.size = local_108.d.size;
            local_108.d.size = qVar4;
            if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)pDVar1 !=
                (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&pDVar1->super_QArrayData)->a).d.d
                   = *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&pDVar1->super_QArrayData)->
                              a).d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&pDVar1->super_QArrayData)->a).
                           d.d == 0) {
                QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
              }
            }
            QFileInfo::fileName((QString *)&local_88,&local_110);
            pcVar2 = local_58.d.ptr;
            pDVar3 = local_58.d.d;
            qVar4 = local_88.a.a.d.size;
            pDVar1 = local_88.a.a.d.d;
            local_88.a.a.d.d = local_58.d.d;
            local_58.d.d = pDVar1;
            local_58.d.ptr = local_88.a.a.d.ptr;
            local_88.a.a.d.ptr = pcVar2;
            local_88.a.a.d.size = local_58.d.size;
            local_58.d.size = qVar4;
            if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)pDVar3 !=
                (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&pDVar3->super_QArrayData)->a).d.d
                   = *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&pDVar3->super_QArrayData)->
                              a).d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&pDVar3->super_QArrayData)->a).
                           d.d == 0) {
                QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
              }
            }
            QFileInfo::~QFileInfo(&local_110);
            goto LAB_0010bc3b;
          }
          QFileInfo::~QFileInfo(&local_110);
        }
        else {
LAB_0010bc3b:
          QFileInfo::QFileInfo((QFileInfo *)&local_128,&local_58);
          QFileInfo::baseName((QString *)&local_88,(QFileInfo *)&local_128);
          bVar5 = QString::startsWith((QString *)&local_88,(QChar)0x71,CaseInsensitive);
          if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_88.a.a.d.d !=
              (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
            LOCK();
            *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_88.a.a.d.d)->super_QArrayData
                      )->a).d.d =
                 *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                           &(local_88.a.a.d.d)->super_QArrayData)->a).d.d + -1;
            UNLOCK();
            if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                          &(local_88.a.a.d.d)->super_QArrayData)->a).d.d == 0) {
              QArrayData::deallocate(&(local_88.a.a.d.d)->super_QArrayData,2,0x10);
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_128);
          if (bVar5) {
            local_88.a.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_88.a.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_88.a.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            resolveInclude((QString *)&local_88,this,&local_108);
            if ((storage_type_conflict *)local_88.a.a.d.size != (storage_type_conflict *)0x0) {
              str.m_size = 1;
              str.m_data = (storage_type_conflict *)local_88.a.a.d.size;
              bVar5 = QtPrivate::QStringList_contains
                                ((QtPrivate *)includes,(QStringList *)local_88.a.a.d.ptr,str,
                                 (CaseSensitivity)uVar7);
              if (!bVar5) {
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)includes,(includes->d).size,
                           (QString *)&local_88);
                QList<QString>::end(includes);
                addIncludesRecursive(this,(QString *)&local_88,includes);
              }
            }
            if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_88.a.a.d.d
                != (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
              LOCK();
              *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                        &(local_88.a.a.d.d)->super_QArrayData)->a).d.d =
                   *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                             &(local_88.a.a.d.d)->super_QArrayData)->a).d.d + -1;
              UNLOCK();
              if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                            &(local_88.a.a.d.d)->super_QArrayData)->a).d.d == 0) {
                QArrayData::deallocate(&(local_88.a.a.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
        if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_108.d.d !=
            (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_108.d.d)->super_QArrayData)->a)
                   .d.d =
               *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_108.d.d)->super_QArrayData
                         )->a).d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_108.d.d)->super_QArrayData)
                       ->a).d.d == 0) {
            QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)local_58.d.d !=
            (QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString_&> *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_58.d.d)->super_QArrayData)->a).
                   d.d = *(int *)&(((QStringBuilder<QString,_QLatin1Char> *)
                                   &(local_58.d.d)->super_QArrayData)->a).d.d + -1;
          UNLOCK();
          if (*(int *)&(((QStringBuilder<QString,_QLatin1Char> *)&(local_58.d.d)->super_QArrayData)
                       ->a).d.d == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        QRegularExpressionMatch::~QRegularExpressionMatch(&local_e8);
        bVar5 = QRegularExpressionMatchIterator::hasNext
                          ((QRegularExpressionMatchIterator *)&local_e0);
      } while (bVar5);
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)&local_e0);
    QRegularExpression::~QRegularExpression((QRegularExpression *)local_d8);
    QTextStream::~QTextStream((QTextStream *)(local_d8 + 8));
    if ((QArrayData *)local_d8._16_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._16_8_,2,0x10);
      }
    }
  }
  QFile::~QFile((QFile *)&local_a8);
  QFileInfo::~QFileInfo(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::addIncludesRecursive(const QString &filename, QList<QString> &includes)
{
    QFileInfo info(filename);
    DEBUGPRINTF(printf("check include: %s\n", qPrintable(filename)));
    QFile input(filename);
    if (!input.open(QIODevice::ReadOnly | QIODevice::Text)) {
        DEBUGPRINTF(printf("Cannot open '%s' for reading: %s\n",
                            qPrintable(filename), qPrintable(input.errorString())));
        return;
    }
    QString data;
    QTextStream stream(&input);
    while (!stream.atEnd()) {
        QString line = stream.readLine().trimmed();
        data += line + QLatin1Char(QLatin1Char('\n'));
    }

    QRegularExpression includeMacro(QStringLiteral("#include [\"<]([A-Za-z0-9_./-]*.h)[\">]"));
    QRegularExpressionMatchIterator i = includeMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        QString filename = match.captured(1);

        QString rinc = filename;
        if (filename.startsWith(QStringLiteral("../"))) {
            QFileInfo info2(info.absolutePath() + QLatin1Char('/') + filename);
            if (!info2.exists()) {
                DEBUGPRINTF(printf("unable to find %s\n", qPrintable(filename)));
                continue;
            }
            rinc = info2.absoluteFilePath();
            filename = info2.fileName();
        }
        // only search possible qt headers
        if (QFileInfo(filename).baseName().startsWith(QLatin1Char('q'), Qt::CaseInsensitive)) {
            QString resolved = resolveInclude(rinc);
            if (!resolved.isEmpty() && !includes.contains(resolved)) {
                includes.push_back(resolved);
                addIncludesRecursive(resolved, includes);
            }
        }
    }
}